

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O3

unsigned_long
libssh2_channel_receive_window_adjust(LIBSSH2_CHANNEL *channel,unsigned_long adj,uchar force)

{
  int iVar1;
  time_t start_time;
  uint window;
  uint local_2c;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return 0xffffffffffffffd9;
  }
  start_time = time((time_t *)0x0);
  while( true ) {
    iVar1 = _libssh2_channel_receive_window_adjust(channel,(uint32_t)adj,force,&local_2c);
    if (iVar1 != -0x25) {
      if (iVar1 == 0) {
        return (ulong)local_2c;
      }
      return (long)iVar1;
    }
    if (channel->session->api_block_mode == 0) break;
    iVar1 = _libssh2_wait_socket(channel->session,start_time);
    if (iVar1 != 0) {
LAB_0010b960:
      return (long)iVar1;
    }
  }
  iVar1 = -0x25;
  goto LAB_0010b960;
}

Assistant:

LIBSSH2_API unsigned long
libssh2_channel_receive_window_adjust(LIBSSH2_CHANNEL *channel,
                                      unsigned long adj,
                                      unsigned char force)
{
    unsigned int window;
    int rc;

    if(!channel)
        return (unsigned long)LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_receive_window_adjust(channel,
                                                        (uint32_t)adj,
                                                        force, &window));

    /* stupid - but this is how it was made to work before and this is just
       kept for backwards compatibility */
    return rc ? (unsigned long)rc : window;
}